

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

char fsnav_init_gnss_gal(fsnav_gnss_gal *gal,size_t max_sat_count,size_t max_eph_count)

{
  fsnav_gnss_sat *pfVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  pfVar1 = (fsnav_gnss_sat *)calloc(max_sat_count,0x90);
  gal->max_sat_count = 0;
  gal->max_eph_count = 0;
  gal->sat = pfVar1;
  if (pfVar1 != (fsnav_gnss_sat *)0x0) {
    gal->max_sat_count = max_sat_count;
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < max_sat_count; uVar4 = uVar4 + 1) {
      fsnav_init_gnss_sat((fsnav_gnss_sat *)((long)gal->sat->x + lVar3 + -0x30));
      max_sat_count = gal->max_sat_count;
      lVar3 = lVar3 + 0x90;
    }
    lVar5 = max_sat_count + 1;
    lVar3 = 0;
    do {
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) {
        gal->max_eph_count = max_eph_count;
        gal->iono_valid = '\0';
        gal->clock_corr_valid = '\0';
        gal->obs_types = (char (*) [4])0x0;
        gal->obs_count = 0;
        return '\x01';
      }
      pvVar2 = calloc(max_eph_count,8);
      *(void **)((long)gal->sat->x + lVar3 + -0x30) = pvVar2;
      lVar3 = lVar3 + 0x90;
    } while (pvVar2 != (void *)0x0);
  }
  return '\0';
}

Assistant:

char fsnav_init_gnss_gal(fsnav_gnss_gal* gal, const size_t max_sat_count, const size_t max_eph_count)
{
	size_t i;

	gal->sat = NULL;
	gal->max_sat_count = 0;
	gal->max_eph_count = 0;

	// try to allocate memory for satellite data
	gal->sat = (fsnav_gnss_sat*)calloc(max_sat_count, sizeof(fsnav_gnss_sat));
	if (gal->sat == NULL)
		return 0;
	gal->max_sat_count = max_sat_count;

	// initialize satellite data
	for (i = 0; i < gal->max_sat_count; i++) 
		fsnav_init_gnss_sat(gal->sat + i);

	// try to allocate memory for each satellite ephemeris
	for (i = 0; i < gal->max_sat_count; i++) {
		gal->sat[i].eph = (double*)calloc(max_eph_count, sizeof(double));
		if (gal->sat[i].eph == NULL)
			return 0;
	}
	gal->max_eph_count = max_eph_count;

	// observation types
	gal->obs_types = NULL;
	gal->obs_count = 0;

	// validity flags
	gal->iono_valid = 0;
	gal->clock_corr_valid = 0;

	return 1;
}